

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this)

{
  clear(this);
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}